

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::DisassembleRequest>::copyConstruct
          (BasicTypeInfo<dap::DisassembleRequest> *this,void *dst,void *src)

{
  *(undefined8 *)dst = *src;
  *(undefined8 *)((long)dst + 8) = *(undefined8 *)((long)src + 8);
  *(undefined1 *)((long)dst + 0x10) = *(undefined1 *)((long)src + 0x10);
  *(long *)((long)dst + 0x18) = (long)dst + 0x28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)dst + 0x18),*(long *)((long)src + 0x18),
             *(long *)((long)src + 0x20) + *(long *)((long)src + 0x18));
  *(undefined8 *)((long)dst + 0x38) = *(undefined8 *)((long)src + 0x38);
  *(undefined1 *)((long)dst + 0x40) = *(undefined1 *)((long)src + 0x40);
  *(undefined1 *)((long)dst + 0x48) = *(undefined1 *)((long)src + 0x48);
  *(undefined1 *)((long)dst + 0x49) = *(undefined1 *)((long)src + 0x49);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }